

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
::unchecked_rehash(table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *this,arrays_type *new_arrays_)

{
  size_t sVar1;
  value_type_pointer ppVar2;
  size_t sVar3;
  size_t num_destroyed;
  undefined8 local_30;
  table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::pair<unsigned_int,_unsigned_int>,_void>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *local_28;
  arrays_type *local_20;
  undefined8 *local_18;
  
  local_18 = &local_30;
  local_30 = 0;
  local_28 = this;
  local_20 = new_arrays_;
  for_all_elements_while<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____external_boost_unordered_hpp:6916:41)>
            (&this->arrays,(anon_class_24_3_45a051ed *)&local_28);
  delete_arrays(this,&this->arrays);
  sVar3 = new_arrays_->groups_size_index;
  sVar1 = new_arrays_->groups_size_mask;
  ppVar2 = new_arrays_->elements_;
  (this->arrays).groups_ = new_arrays_->groups_;
  (this->arrays).elements_ = ppVar2;
  (this->arrays).groups_size_index = sVar3;
  (this->arrays).groups_size_mask = sVar1;
  sVar3 = initial_max_load(this);
  (this->size_ctrl).ml = sVar3;
  return;
}

Assistant:

BOOST_NOINLINE void unchecked_rehash(arrays_type& new_arrays_) {
        std::size_t num_destroyed = 0;
        BOOST_TRY {
            for_all_elements([&, this](element_type* p) {
                nosize_transfer_element(p, new_arrays_, num_destroyed);
            });
        }